

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O0

char * stripcredentials(char *url)

{
  char *local_30;
  char *nurl;
  long lStack_20;
  CURLUcode uc;
  CURLU *u;
  char *url_local;
  
  u = (CURLU *)url;
  lStack_20 = curl_url();
  if ((((lStack_20 == 0) || (nurl._4_4_ = curl_url_set(lStack_20,0,u,0x200), nurl._4_4_ != 0)) ||
      (nurl._4_4_ = curl_url_set(lStack_20,2,0,0), nurl._4_4_ != 0)) ||
     ((nurl._4_4_ = curl_url_set(lStack_20,3,0,0), nurl._4_4_ != 0 ||
      (nurl._4_4_ = curl_url_get(lStack_20,0,&local_30), nurl._4_4_ != 0)))) {
    curl_url_cleanup(lStack_20);
    url_local = (char *)0x0;
  }
  else {
    curl_url_cleanup(lStack_20);
    url_local = local_30;
  }
  return url_local;
}

Assistant:

char *stripcredentials(const char *url)
{
  CURLU *u;
  CURLUcode uc;
  char *nurl;
  u = curl_url();
  if(u) {
    uc = curl_url_set(u, CURLUPART_URL, url, CURLU_GUESS_SCHEME);
    if(uc)
      goto error;

    uc = curl_url_set(u, CURLUPART_USER, NULL, 0);
    if(uc)
      goto error;

    uc = curl_url_set(u, CURLUPART_PASSWORD, NULL, 0);
    if(uc)
      goto error;

    uc = curl_url_get(u, CURLUPART_URL, &nurl, 0);
    if(uc)
      goto error;

    curl_url_cleanup(u);

    return nurl;
  }
error:
  curl_url_cleanup(u);
  return NULL;
}